

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BayesianGameBase::JointToIndividualPolicyDomainIndicesRef
          (BayesianGameBase *this,Index jdI,PolicyDomainCategory cat)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  
  pvVar1 = JointToIndividualTypeIndices(this,jdI);
  return pvVar1;
}

Assistant:

const std::vector<Index>& JointToIndividualPolicyDomainIndicesRef
            (Index jdI, PolicyGlobals::PolicyDomainCategory cat) const
        {
#if 0 // disable check for speed
            if(cat != PolicyGlobals::TYPE_INDEX)
                throw(E("BG only supports type as the domain of the policy"));
#endif
//            return( _m_jointToIndTypes[jdI]);
            return(JointToIndividualTypeIndices(jdI));
        }